

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_styles.cpp
# Opt level: O1

void __thiscall Am_Style_Data::~Am_Style_Data(Am_Style_Data *this)

{
  Display *pDVar1;
  Color_Index *pCVar2;
  undefined8 uVar3;
  Am_Style_Data **ppAVar4;
  Am_Style_Data *pAVar5;
  Am_Style_Data *pAVar6;
  Color_Index *pCVar7;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e46d0;
  if ((this->color_name != (char *)0x0) && (this->color_allocated == true)) {
    operator_delete__(this->color_name);
  }
  if (this->dash_list != (char *)0x0) {
    operator_delete__(this->dash_list);
  }
  pDVar1 = this->main_display;
  if ((pDVar1 != (Display *)0x0) && (this->color_allocated == true)) {
    uVar3 = XDefaultColormap(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
    XFreeColors(this->main_display,uVar3,&this->main_color,1,0);
  }
  pCVar7 = this->color_head;
  while (pCVar7 != (Color_Index *)0x0) {
    pDVar1 = pCVar7->dpy;
    pCVar2 = pCVar7->next;
    pCVar7->next = (Color_Index *)0x0;
    if ((pDVar1 != (Display *)0x0) && (this->color_allocated == true)) {
      uVar3 = XDefaultColormap(pDVar1,*(undefined4 *)(pDVar1 + 0xe0));
      XFreeColors(pCVar7->dpy,uVar3,&pCVar7->index,1,0);
    }
    operator_delete(pCVar7);
    pCVar7 = pCVar2;
  }
  this->color_head = (Color_Index *)0x0;
  ppAVar4 = &list;
  if (list != (Am_Style_Data *)0x0) {
    pAVar5 = list;
    if (list == this) {
      pAVar6 = (Am_Style_Data *)0x0;
    }
    else {
      do {
        pAVar6 = pAVar5;
        pAVar5 = pAVar6->next;
        if (pAVar5 == (Am_Style_Data *)0x0) goto LAB_0027f04c;
      } while (pAVar5 != this);
    }
    if (pAVar6 != (Am_Style_Data *)0x0) {
      ppAVar4 = &pAVar6->next;
    }
    *ppAVar4 = pAVar5->next;
  }
LAB_0027f04c:
  Am_Image_Array::~Am_Image_Array(&this->stipple_bitmap);
  return;
}

Assistant:

Am_Style_Data::~Am_Style_Data()
{
  if (color_name && color_allocated)
    delete[] color_name;
  if (dash_list)
    delete[] dash_list;
  if (main_display) {
    // BUG: X index deletion will not work properly if some application
    // has changed the default colormap.
    // I'm not sure that's actually a bug (af1x 12-6-95)
    if (color_allocated) {
      int screen_num = DefaultScreen(main_display);
      Colormap c = XDefaultColormap(main_display, screen_num);
      XFreeColors(main_display, c, &main_color.pixel, 1, 0);
      // simulate an array of length 1
    }
  }
  Color_Index *current = color_head;
  Color_Index *next = nullptr;
  while (current) {
    next = current->next;
    current->next = nullptr;
    if (current->dpy) {
      if (color_allocated) {
        int screen_num = DefaultScreen(current->dpy);
        Colormap c = XDefaultColormap(current->dpy, screen_num);
        XFreeColors(current->dpy, c, &current->index.pixel, 1, 0);
        // simulate an array of length 1
      }
    }
    delete current;
    current = next;
  }
  color_head = nullptr;
  remove(this);
}